

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98c_action.c
# Opt level: O3

void s98c_write(s98c *ctx,uint8_t n)

{
  uint8_t *__ptr;
  uint8_t *puVar1;
  uint8_t *puVar2;
  long lVar3;
  size_t __size;
  uint8_t *puVar4;
  long lVar5;
  
  puVar4 = ctx->p;
  __ptr = ctx->dump_buffer;
  if (__ptr + ctx->dump_size <= puVar4) {
    puVar1 = ctx->loop_start;
    lVar5 = (long)ctx->dump_start - (long)__ptr;
    if (ctx->dump_start == (uint8_t *)0x0) {
      lVar5 = 0;
    }
    __size = ctx->dump_size + 0x4000;
    ctx->dump_size = __size;
    puVar2 = (uint8_t *)realloc(__ptr,__size);
    ctx->dump_buffer = puVar2;
    if (ctx->loop_start != (uint8_t *)0x0) {
      lVar3 = (long)puVar1 - (long)__ptr;
      if (puVar1 == (uint8_t *)0x0) {
        lVar3 = 0;
      }
      ctx->loop_start = puVar2 + lVar3;
    }
    puVar4 = puVar2 + ((long)puVar4 - (long)__ptr);
    if (ctx->dump_start != (uint8_t *)0x0) {
      ctx->dump_start = puVar2 + lVar5;
    }
  }
  ctx->p = puVar4 + 1;
  *puVar4 = n;
  return;
}

Assistant:

void s98c_write(struct s98c* ctx, uint8_t n)
{
    if(ctx->p >= ctx->dump_buffer + ctx->dump_size) {
        ptrdiff_t p_offset = ctx->p - ctx->dump_buffer;
        ptrdiff_t loop_offset = 0, dump_offset = 0;

        if(ctx->loop_start != NULL) {
            loop_offset = ctx->loop_start - ctx->dump_buffer;
        }
        if(ctx->dump_start != NULL) {
            dump_offset = ctx->dump_start - ctx->dump_buffer;
        }

        ctx->dump_size += DUMP_SIZE_INCREMENT;
        ctx->dump_buffer = realloc(ctx->dump_buffer, ctx->dump_size);

        ctx->p = ctx->dump_buffer + p_offset;
        if(ctx->loop_start != NULL) {
            ctx->loop_start = ctx->dump_buffer + loop_offset;
        }
        if(ctx->dump_start != NULL) {
            ctx->dump_start = ctx->dump_buffer + dump_offset;
        }
    }
    
    *ctx->p++ = n;
}